

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clSetKernelArgMemPointerINTEL(cl_kernel kernel,cl_uint arg_index,void *arg_value)

{
  time_point tickEnd;
  bool bVar1;
  CLIntercept *this;
  CLdispatchX *pCVar2;
  uint64_t enqueueCounter_00;
  SConfig *pSVar3;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDX;
  cl_uint in_ESI;
  cl_kernel in_RDI;
  void *unaff_retaddr;
  cl_kernel in_stack_00000008;
  CLIntercept *in_stack_00000010;
  cl_int retVal;
  time_point cpuEnd;
  time_point cpuStart;
  uint64_t enqueueCounter;
  CLdispatchX *dispatchX;
  CLIntercept *pIntercept;
  CLIntercept *in_stack_00000110;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 uVar4;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffef0;
  CLIntercept *in_stack_fffffffffffffef8;
  CLIntercept *in_stack_ffffffffffffff00;
  allocator *paVar5;
  int local_e4;
  CLIntercept *local_e0;
  CLIntercept *local_d8;
  allocator local_c9;
  string local_c8 [32];
  duration local_a8;
  time_point in_stack_ffffffffffffff60;
  cl_event *in_stack_ffffffffffffff68;
  cl_uint in_stack_ffffffffffffff74;
  cl_kernel in_stack_ffffffffffffff78;
  CLIntercept *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff8f;
  string *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  CLIntercept *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  time_point in_stack_ffffffffffffffb0;
  time_point in_stack_ffffffffffffffb8;
  time_point in_stack_ffffffffffffffc0;
  cl_int local_4;
  
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  this = GetIntercept();
  if ((this == (CLIntercept *)0x0) ||
     (pCVar2 = CLIntercept::dispatchX
                         (in_stack_ffffffffffffff00,(cl_kernel)in_stack_fffffffffffffef8),
     pCVar2->clSetKernelArgMemPointerINTEL == (_func_cl_int_cl_kernel_cl_uint_void_ptr *)0x0)) {
    local_e4 = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_e4);
    local_4 = -0x30;
  }
  else {
    enqueueCounter_00 = CLIntercept::getEnqueueCounter(in_stack_fffffffffffffef8);
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->CallLogging & 1U) != 0) {
      in_stack_fffffffffffffef0 = in_RDX;
      CLIntercept::callLoggingEnter
                (this,"clSetKernelArgMemPointerINTEL",enqueueCounter_00,in_RDI,
                 "kernel = %p, index = %u, value = %p",in_RDI,CONCAT44(uVar4,in_ESI));
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->USMChecking & 1U) != 0) {
      CLIntercept::checkKernelArgUSMPointer(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    }
    pSVar3 = CLIntercept::config(this);
    if (((((pSVar3->DumpBuffersBeforeEnqueue & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(this), (pSVar3->DumpBuffersAfterEnqueue & 1U) != 0)) ||
        (pSVar3 = CLIntercept::config(this), (pSVar3->InjectBuffers & 1U) != 0)) ||
       ((pSVar3 = CLIntercept::config(this), (pSVar3->InjectImages & 1U) != 0 ||
        (pSVar3 = CLIntercept::config(this), (pSVar3->CaptureReplay & 1U) != 0)))) {
      CLIntercept::setKernelArgUSMPointer
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                 in_stack_ffffffffffffff68);
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffef0);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffef0);
    pSVar3 = CLIntercept::config(this);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffffb0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffffc0.__d.__r = in_stack_ffffffffffffffb0.__d.__r;
    }
    local_4 = (*pCVar2->clSetKernelArgMemPointerINTEL)(in_RDI,in_ESI,in_RDX);
    pSVar3 = CLIntercept::config(this);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffffa0 = (CLIntercept *)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffffb8.__d.__r = (duration)(duration)in_stack_ffffffffffffffa0;
      pSVar3 = CLIntercept::config(this);
      if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
         (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,enqueueCounter_00),
         bVar1)) {
        std::allocator<char>::allocator();
        local_a8 = in_stack_ffffffffffffffb8.__d.__r;
        in_stack_ffffffffffffff60.__d.__r = in_stack_ffffffffffffffc0.__d.__r;
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff80,"",(allocator *)&stack0xffffffffffffff7f);
        in_stack_ffffffffffffffb8.__d.__r = (duration)(duration)local_a8.__r;
        in_stack_ffffffffffffffc0.__d.__r = in_stack_ffffffffffffff60.__d.__r;
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)in_stack_ffffffffffffffb0.__d.__r,
                   (char *)CONCAT44(local_4,in_stack_ffffffffffffffa8),
                   (string *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff60,
                   (time_point)local_a8.__r);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
      }
    }
    pSVar3 = CLIntercept::config(this);
    if (((((pSVar3->ErrorLogging & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(this), (pSVar3->ErrorAssert & 1U) != 0)) ||
        (pSVar3 = CLIntercept::config(this), (pSVar3->NoErrors & 1U) != 0)) && (local_4 != 0)) {
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_stack_00000110,(char *)kernel,arg_index);
      }
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->NoErrors & 1U) != 0) {
        local_4 = 0;
      }
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,
                 (cl_sync_point_khr *)in_stack_ffffffffffffff60.__d.__r);
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->ChromeCallLogging & 1U) != 0) {
      paVar5 = &local_c9;
      std::allocator<char>::allocator();
      local_e0 = (CLIntercept *)in_stack_ffffffffffffffb8.__d.__r;
      local_d8 = (CLIntercept *)in_stack_ffffffffffffffc0.__d.__r;
      std::__cxx11::string::string(local_c8,"",paVar5);
      tickEnd.__d.__r._4_4_ = local_4;
      tickEnd.__d.__r._0_4_ = in_stack_ffffffffffffffa8;
      CLIntercept::chromeCallLoggingExit
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 (bool)in_stack_ffffffffffffff8f,(uint64_t)in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffffb0,tickEnd);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clSetKernelArgMemPointerINTEL(
    cl_kernel kernel,
    cl_uint arg_index,
    const void* arg_value)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(kernel);
        if( dispatchX.clSetKernelArgMemPointerINTEL )
        {
            GET_ENQUEUE_COUNTER();
            CALL_LOGGING_ENTER_KERNEL(
                kernel,
                "kernel = %p, index = %u, value = %p",
                kernel,
                arg_index,
                arg_value );
            CHECK_KERNEL_ARG_USM_POINTER( kernel, arg_value );
            SET_KERNEL_ARG_USM_POINTER( kernel, arg_index, arg_value );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clSetKernelArgMemPointerINTEL(
                kernel,
                arg_index,
                arg_value );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            CALL_LOGGING_EXIT( retVal );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_KERNEL);
}